

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_fuzzer.cc
# Opt level: O0

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  undefined1 local_88 [8];
  Pl_ASCIIHexDecoder p;
  Pl_Discard discard;
  FuzzHelper *this_local;
  
  Pl_Discard::Pl_Discard((Pl_Discard *)&p.eod);
  Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder((Pl_ASCIIHexDecoder *)local_88,"decode",(Pipeline *)&p.eod)
  ;
  Pl_ASCIIHexDecoder::write
            ((Pl_ASCIIHexDecoder *)local_88,(int)this->data,(void *)this->size,in_RCX);
  Pl_ASCIIHexDecoder::finish((Pl_ASCIIHexDecoder *)local_88);
  Pl_ASCIIHexDecoder::~Pl_ASCIIHexDecoder((Pl_ASCIIHexDecoder *)local_88);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&p.eod);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    Pl_Discard discard;
    Pl_ASCIIHexDecoder p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}